

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c0_compile_symbol.cpp
# Opt level: O0

void __thiscall
FunctionTable::SetTermBottomLabel(FunctionTable *this,string *func_name,string *bottom_label)

{
  bool bVar1;
  __type _Var2;
  pointer pFVar3;
  string local_50;
  __normal_iterator<FunctionTableTerm_*,_std::vector<FunctionTableTerm,_std::allocator<FunctionTableTerm>_>_>
  local_30;
  __normal_iterator<FunctionTableTerm_*,_std::vector<FunctionTableTerm,_std::allocator<FunctionTableTerm>_>_>
  local_28;
  iterator iter;
  string *bottom_label_local;
  string *func_name_local;
  FunctionTable *this_local;
  
  iter._M_current = (FunctionTableTerm *)bottom_label;
  local_28._M_current =
       (FunctionTableTerm *)
       std::vector<FunctionTableTerm,_std::allocator<FunctionTableTerm>_>::begin
                 (&this->m_func_table);
  while( true ) {
    local_30._M_current =
         (FunctionTableTerm *)
         std::vector<FunctionTableTerm,_std::allocator<FunctionTableTerm>_>::end
                   (&this->m_func_table);
    bVar1 = __gnu_cxx::operator!=(&local_28,&local_30);
    if (!bVar1) break;
    pFVar3 = __gnu_cxx::
             __normal_iterator<FunctionTableTerm_*,_std::vector<FunctionTableTerm,_std::allocator<FunctionTableTerm>_>_>
             ::operator->(&local_28);
    FunctionTableTerm::GetName_abi_cxx11_(&local_50,pFVar3);
    _Var2 = std::operator==(&local_50,func_name);
    std::__cxx11::string::~string((string *)&local_50);
    if (_Var2) {
      pFVar3 = __gnu_cxx::
               __normal_iterator<FunctionTableTerm_*,_std::vector<FunctionTableTerm,_std::allocator<FunctionTableTerm>_>_>
               ::operator->(&local_28);
      FunctionTableTerm::SetBottomLabel(pFVar3,&(iter._M_current)->m_func_name);
    }
    __gnu_cxx::
    __normal_iterator<FunctionTableTerm_*,_std::vector<FunctionTableTerm,_std::allocator<FunctionTableTerm>_>_>
    ::operator++(&local_28);
  }
  return;
}

Assistant:

void FunctionTable::SetTermBottomLabel(const string& func_name, const string& bottom_label) {
    auto iter = m_func_table.begin();
    for (; iter != m_func_table.end(); ++iter) {
        if (iter->GetName() == func_name) {
            iter->SetBottomLabel(bottom_label);
        }
    }
}